

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.h
# Opt level: O3

void __thiscall Layer::Layer(Layer *this,int nodes,int nextNodes)

{
  int iVar1;
  char *__function;
  ActualDstType actualDst;
  Index dstRows_1;
  ActualDstType actualDst_2;
  Index dstRows;
  long lVar2;
  ActualDstType actualDst_1;
  assign_op<float,_float> local_59;
  VectorXf *local_58;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  local_50;
  VectorXf *local_38;
  
  this->size = nodes;
  this->nextSize = nextNodes;
  local_50.m_rows.m_value = (long)nextNodes;
  local_50.m_cols.m_value = (long)nodes;
  local_50.m_functor.m_other = 0.0;
  if (-1 < (nextNodes | nodes)) {
    (this->weights).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (float *)0x0;
    (this->weights).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = 0;
    (this->weights).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>>
              (&this->weights,&local_50,&local_59);
    local_50.m_rows.m_value = (long)this->nextSize;
    local_50.m_cols.m_value = (long)this->size;
    local_50.m_functor.m_other = 0.0;
    if (-1 < (this->size | this->nextSize)) {
      (this->weightGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (float *)0x0;
      (this->weightGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = 0;
      (this->weightGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = 0;
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>>
                (&this->weightGrads,&local_50,&local_59);
      iVar1 = this->size;
      lVar2 = (long)iVar1;
      if (-1 < lVar2) {
        (this->bias).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
             = (float *)0x0;
        (this->bias).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             = 0;
        if (iVar1 == 0) {
          (this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_data = (float *)0x0;
          (this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = 0;
LAB_001067c0:
          (this->output).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_data = (float *)0x0;
          (this->output).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = 0;
LAB_001067c5:
          (this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_data = (float *)0x0;
          (this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = 0;
          return;
        }
        Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<float,__1,__1,_1,_0> *)&this->bias,lVar2,lVar2,1);
        if ((this->bias).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != lVar2) goto LAB_0010680f;
        memset((this->bias).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data,0,lVar2 << 2);
        iVar1 = this->size;
        lVar2 = (long)iVar1;
        if (-1 < lVar2) {
          (this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_data = (float *)0x0;
          (this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = 0;
          if (iVar1 == 0) goto LAB_001067c0;
          Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                    ((DenseStorage<float,__1,__1,_1,_0> *)&this->biasGrads,lVar2,lVar2,1);
          if ((this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != lVar2) goto LAB_0010680f;
          memset((this->biasGrads).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data,0,lVar2 << 2);
          iVar1 = this->size;
          lVar2 = (long)iVar1;
          if (-1 < lVar2) {
            local_38 = &this->output;
            (local_38->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
            m_data = (float *)0x0;
            (this->output).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = 0;
            if (iVar1 == 0) goto LAB_001067c5;
            Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                      ((DenseStorage<float,__1,__1,_1,_0> *)local_38,lVar2,lVar2,1);
            if ((this->output).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != lVar2) {
LAB_0010680f:
              __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                            "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>, T1 = float, T2 = float]"
                           );
            }
            memset((this->output).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data,0,lVar2 << 2);
            iVar1 = this->size;
            lVar2 = (long)iVar1;
            if (-1 < lVar2) {
              (this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = (float *)0x0;
              (this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = 0;
              if (iVar1 == 0) {
                return;
              }
              local_58 = &this->loss;
              Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                        ((DenseStorage<float,__1,__1,_1,_0> *)local_58,lVar2,lVar2,1);
              if ((this->loss).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows == lVar2) {
                memset((local_58->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data,0,lVar2 << 2);
                return;
              }
              goto LAB_0010680f;
            }
          }
        }
      }
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 1>]"
      ;
      goto LAB_00106805;
    }
  }
  local_50.m_functor.m_other = 0.0;
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
  ;
LAB_00106805:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

Layer(int nodes, int nextNodes)
        : size(nodes), nextSize(nextNodes), weights(Eigen::MatrixXf::Zero(nextSize, nodes)),
          weightGrads(Eigen::MatrixXf::Zero(nextSize, size)), bias(Eigen::VectorXf::Zero(size)),
          biasGrads(Eigen::VectorXf::Zero(size)), output(Eigen::VectorXf::Zero(size)),
          loss(Eigen::VectorXf::Zero(size)){}